

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O1

bool TasOptimization::testParticleSwarmState(bool verbose)

{
  double dVar1;
  double dVar2;
  _Bit_type _Var3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined8 uVar8;
  value_type_conflict1 *__val;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  byte bVar14;
  bool bVar15;
  long lVar16;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  char *pcVar17;
  undefined7 in_register_00000039;
  ulong uVar18;
  double dVar19;
  initializer_list<TasOptimization::ParticleSwarmState> __l;
  initializer_list<bool> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<bool> __l_03;
  initializer_list<bool> __l_04;
  initializer_list<bool> __l_05;
  vector<bool,_std::allocator<bool>_> init_vector;
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  states;
  vector<double,_std::allocator<double>_> ones1;
  vector<double,_std::allocator<double>_> ones2;
  vector<double,_std::allocator<double>_> dummy_velocities;
  vector<double,_std::allocator<double>_> dummy_positions;
  vector<double,_std::allocator<double>_> upper;
  vector<double,_std::allocator<double>_> lower;
  vector<double,_std::allocator<double>_> velocities;
  vector<double,_std::allocator<double>_> positions;
  minstd_rand park_miller;
  ParticleSwarmState state;
  uniform_real_distribution<double> unif;
  allocator_type local_369;
  undefined1 local_368 [16];
  pointer local_358;
  ulong uStack_350;
  _Bit_pointer local_348;
  undefined1 local_338 [16];
  pointer local_328;
  ulong uStack_320;
  _Bit_pointer local_318;
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  local_310;
  vector<double,_std::allocator<double>_> local_2f8;
  undefined4 local_2e0;
  undefined1 local_2dc [4];
  vector<double,_std::allocator<double>_> local_2d8;
  void *local_2b8;
  void *pvStack_2b0;
  long local_2a8;
  void *local_298;
  void *pvStack_290;
  long local_288;
  vector<double,_std::allocator<double>_> local_278;
  vector<double,_std::allocator<double>_> local_260;
  vector<double,_std::allocator<double>_> local_248;
  vector<double,_std::allocator<double>_> local_230;
  undefined8 *local_218;
  undefined8 *puStack_210;
  code *local_208;
  code *pcStack_200;
  undefined8 local_1f8;
  ParticleSwarmState local_1f0 [2];
  undefined8 local_40;
  undefined8 local_38;
  
  local_2e0 = (undefined4)CONCAT71(in_register_00000039,verbose);
  local_298 = (void *)0x0;
  pvStack_290 = (void *)0x0;
  local_288 = 0;
  local_298 = operator_new(0xf0);
  lVar16 = (long)local_298 + 0xf0;
  pvStack_290 = local_298;
  local_288 = lVar16;
  memset(local_298,0,0xf0);
  local_2a8 = 0;
  local_2b8 = (void *)0x0;
  pvStack_2b0 = (void *)0x0;
  pvStack_290 = (void *)lVar16;
  local_2b8 = operator_new(0xf0);
  lVar16 = (long)local_2b8 + 0xf0;
  pvStack_2b0 = local_2b8;
  local_2a8 = lVar16;
  memset(local_2b8,0,0xf0);
  pvStack_2b0 = (void *)lVar16;
  TasOptimization::ParticleSwarmState::ParticleSwarmState(local_1f0,2,0xf);
  TasOptimization::ParticleSwarmState::ParticleSwarmState
            (local_1f0 + 1,2,(vector *)&local_298,(vector *)&local_2b8);
  __l._M_len = 2;
  __l._M_array = local_1f0;
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::vector(&local_310,__l,(allocator_type *)local_368);
  lVar16 = 0xd8;
  do {
    ParticleSwarmState::~ParticleSwarmState
              ((ParticleSwarmState *)(&local_1f0[0].positions_initialized + lVar16));
    lVar16 = lVar16 + -0xd8;
  } while (lVar16 != -0xd8);
  bVar14 = 1;
  lVar16 = 0x40;
  do {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1f0,
               (vector<double,_std::allocator<double>_> *)
               ((long)local_310.
                      super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x30));
    lVar9 = local_1f0[0]._8_8_ - local_1f0[0]._0_8_;
    if ((ulong *)local_1f0[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f0[0]._0_8_,
                      (long)local_1f0[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f0[0]._0_8_);
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1f0,
               (vector<double,_std::allocator<double>_> *)
               ((long)local_310.
                      super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x18));
    lVar10 = local_1f0[0]._8_8_ - local_1f0[0]._0_8_;
    if ((ulong *)local_1f0[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f0[0]._0_8_,
                      (long)local_1f0[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f0[0]._0_8_);
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1f0,
               (vector<double,_std::allocator<double>_> *)
               (&(local_310.
                  super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                  ._M_impl.super__Vector_impl_data._M_start)->positions_initialized + lVar16));
    lVar11 = local_1f0[0]._8_8_ - local_1f0[0]._0_8_;
    if ((ulong *)local_1f0[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f0[0]._0_8_,
                      (long)local_1f0[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f0[0]._0_8_);
    }
    lVar12 = (long)*(int *)((long)local_310.
                                  super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x3c);
    __first._M_current =
         (double *)
         (*(int *)((long)local_310.
                         super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x38) * lVar12 * 8 +
         *(long *)(&(local_310.
                     super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                     ._M_impl.super__Vector_impl_data._M_start)->positions_initialized + lVar16));
    std::vector<double,std::allocator<double>>::
    vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
              ((vector<double,std::allocator<double>> *)local_1f0,__first,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               (__first._M_current + lVar12),(allocator_type *)local_368);
    lVar12 = local_1f0[0]._8_8_ - local_1f0[0]._0_8_;
    if ((ulong *)local_1f0[0]._0_8_ != (ulong *)0x0) {
      operator_delete((void *)local_1f0[0]._0_8_,
                      (long)local_1f0[0].particle_positions.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start - local_1f0[0]._0_8_);
    }
    uVar8 = local_368._0_8_;
    local_368[1] = *(undefined1 *)
                    ((long)local_310.
                           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x3f);
    local_368[0] = *(undefined1 *)
                    ((long)local_310.
                           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x40);
    local_368[2] = *(undefined1 *)
                    ((long)local_310.
                           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x3e);
    local_368._4_4_ = SUB84(uVar8,4);
    local_368[3] = *(undefined1 *)
                    ((long)local_310.
                           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar16 + -0x3d);
    __l_00._M_len = 4;
    __l_00._M_array = (iterator)local_368;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_1f0,__l_00,(allocator_type *)local_338);
    uVar18 = *(ulong *)local_1f0[0]._0_8_;
    bVar14 = (uVar18 & 0xc) == 0 & ((byte)((uVar18 & 0xffffffff) >> 1) & 0x7f ^ lVar16 == 0x40) &
             (lVar16 == 0x40 ^ (byte)uVar18) &
             bVar14 & lVar9 == 0xf0 & lVar10 == 0xf0 & lVar11 == 0x100 & lVar12 == 0x10;
    operator_delete((void *)local_1f0[0]._0_8_,
                    (long)local_1f0[0].particle_positions.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage - local_1f0[0]._0_8_);
    lVar16 = lVar16 + 0xd8;
  } while (lVar16 == 0x118);
  local_1f0[0].positions_initialized = false;
  local_1f0[0].velocities_initialized = false;
  local_1f0[0].best_positions_initialized = false;
  local_1f0[0].cache_initialized = false;
  local_1f0[0].num_dimensions = -0x40100000;
  local_1f0[0].num_particles = 0;
  local_1f0[0]._12_4_ = 0x3ff00000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1f0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_260,__l_01,(allocator_type *)local_368);
  local_1f0[0].positions_initialized = false;
  local_1f0[0].velocities_initialized = false;
  local_1f0[0].best_positions_initialized = false;
  local_1f0[0].cache_initialized = false;
  local_1f0[0].num_dimensions = 0x40000000;
  local_1f0[0].num_particles = 0;
  local_1f0[0]._12_4_ = 0x40080000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1f0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_278,__l_02,(allocator_type *)local_368);
  puStack_210 = &local_1f8;
  local_1f8 = 0x2a;
  local_218 = &local_40;
  local_40 = 0;
  local_38 = 0x3ff0000000000000;
  pcStack_200 = std::
                _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:86:21)>
                ::_M_invoke;
  local_208 = std::
              _Function_handler<double_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:86:21)>
              ::_M_manager;
  TasOptimization::ParticleSwarmState::initializeParticlesInsideBox
            (local_310.
             super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_260,&local_278);
  if (local_208 != (code *)0x0) {
    (*local_208)(&local_218,&local_218,3);
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_230,
             &(local_310.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->particle_positions);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_248,
             &(local_310.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->particle_velocities);
  uVar8 = local_1f0[0]._0_8_;
  lVar16 = 0;
  do {
    uVar18 = (ulong)(((uint)lVar16 & 1) << 3);
    dVar1 = *(double *)
             ((long)local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar18);
    dVar2 = *(double *)
             ((long)local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar18);
    dVar19 = ABS(dVar2 - dVar1);
    bVar14 = -(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16] <= dVar19 + 1e-12) &
             -(-1e-12 - dVar19 <=
              local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar16]) &
             local_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar16] <= dVar2 + 1e-12 &
             dVar1 + -1e-12 <=
             local_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar16] & bVar14;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x1e);
  uVar4 = (local_310.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->positions_initialized;
  uVar5 = (local_310.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->velocities_initialized;
  uVar6 = (local_310.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->best_positions_initialized;
  uVar7 = (local_310.
           super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
           ._M_impl.super__Vector_impl_data._M_start)->cache_initialized;
  local_1f0[0].cache_initialized = (bool)uVar7;
  local_1f0[0].best_positions_initialized = (bool)uVar6;
  local_1f0[0].velocities_initialized = (bool)uVar5;
  local_1f0[0].positions_initialized = (bool)uVar4;
  local_1f0[0].num_dimensions = SUB84(uVar8,4);
  __l_03._M_len = 4;
  __l_03._M_array = &local_1f0[0].positions_initialized;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_368,__l_03,(allocator_type *)local_338);
  _Var3 = *(_Bit_type *)local_368._0_8_;
  TasOptimization::ParticleSwarmState::ParticleSwarmState(local_1f0,2,0xf);
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0xf0);
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 0x1e;
  lVar16 = 0;
  do {
    *(undefined8 *)
     ((long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar16) = 0x3ff0000000000000;
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0xf0);
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x100);
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 0x20;
  lVar16 = 0;
  do {
    *(undefined8 *)
     ((long)local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar16) = 0x3ff0000000000000;
    lVar16 = lVar16 + 8;
  } while (lVar16 != 0x100);
  local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  ParticleSwarmState::setParticlePositions(local_1f0,&local_2f8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_338,&local_1f0[0].particle_positions);
  bVar14 = bVar14 & ((uint)_Var3 & 3) == 3;
  for (pdVar13 = (double *)local_338._0_8_; pdVar13 != (double *)local_338._8_8_;
      pdVar13 = pdVar13 + 1) {
    bVar14 = bVar14 & *pdVar13 == 1.0;
  }
  if ((double *)local_338._0_8_ != (double *)0x0) {
    operator_delete((void *)local_338._0_8_,(long)local_328 - local_338._0_8_);
  }
  ParticleSwarmState::setParticleVelocities(local_1f0,&local_2f8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_338,&local_1f0[0].particle_velocities)
  ;
  for (pdVar13 = (double *)local_338._0_8_; pdVar13 != (double *)local_338._8_8_;
      pdVar13 = pdVar13 + 1) {
    bVar14 = bVar14 & *pdVar13 == 1.0;
  }
  if ((double *)local_338._0_8_ != (double *)0x0) {
    operator_delete((void *)local_338._0_8_,(long)local_328 - local_338._0_8_);
  }
  ParticleSwarmState::setBestParticlePositions(local_1f0,&local_2d8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_338,
             &local_1f0[0].best_particle_positions);
  for (pdVar13 = (double *)local_338._0_8_; pdVar13 != (double *)local_338._8_8_;
      pdVar13 = pdVar13 + 1) {
    bVar14 = bVar14 & *pdVar13 == 1.0;
  }
  if ((double *)local_338._0_8_ != (double *)0x0) {
    operator_delete((void *)local_338._0_8_,(long)local_328 - local_338._0_8_);
  }
  uVar8 = local_1f0[0]._0_8_;
  local_2dc[0] = local_1f0[0].positions_initialized;
  local_2dc[1] = local_1f0[0].velocities_initialized;
  local_2dc[2] = local_1f0[0].best_positions_initialized;
  local_2dc[3] = local_1f0[0].cache_initialized;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_2dc;
  local_1f0[0]._0_8_ = uVar8;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_338,__l_04,&local_369);
  if ((_Bit_type *)local_368._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_368._0_8_,(long)local_348 - local_368._0_8_);
  }
  local_348 = local_318;
  local_358 = local_328;
  uStack_350 = uStack_320;
  local_368._0_8_ = local_338._0_8_;
  local_368._8_8_ = local_338._8_8_;
  dVar1 = *(double *)local_338._0_8_;
  local_1f0[0].best_positions_initialized = false;
  if (local_1f0[0].best_particle_positions.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1f0[0].best_particle_positions.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    memset(local_1f0[0].best_particle_positions.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start,0,
           (long)local_1f0[0].best_particle_positions.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)local_1f0[0].best_particle_positions.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start & 0xfffffffffffffff8);
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_338,
             &(local_310.
               super__Vector_base<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
               ._M_impl.super__Vector_impl_data._M_start)->best_particle_positions);
  bVar14 = bVar14 & (SUB84(dVar1,0) & 7) == 7;
  for (pdVar13 = (double *)local_338._0_8_; pdVar13 != (double *)local_338._8_8_;
      pdVar13 = pdVar13 + 1) {
    bVar14 = bVar14 & *pdVar13 == 0.0;
  }
  if ((double *)local_338._0_8_ != (double *)0x0) {
    operator_delete((void *)local_338._0_8_,(long)local_328 - local_338._0_8_);
  }
  uVar8 = local_1f0[0]._0_8_;
  local_2dc[0] = local_1f0[0].positions_initialized;
  local_2dc[1] = local_1f0[0].velocities_initialized;
  local_2dc[2] = local_1f0[0].best_positions_initialized;
  local_2dc[3] = local_1f0[0].cache_initialized;
  __l_05._M_len = 4;
  __l_05._M_array = (iterator)local_2dc;
  local_1f0[0]._0_8_ = uVar8;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_338,__l_05,&local_369);
  if ((double *)local_368._0_8_ != (double *)0x0) {
    operator_delete((void *)local_368._0_8_,(long)local_348 - local_368._0_8_);
  }
  local_348 = local_318;
  local_358 = local_328;
  uStack_350 = uStack_320;
  local_368._0_8_ = local_338._0_8_;
  local_368._8_8_ = local_338._8_8_;
  bVar15 = (bool)(bVar14 & ((ulong)*(double *)local_338._0_8_ & 4) == 0);
  if ((byte)(bVar15 ^ 1U | (byte)local_2e0) == 1) {
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x14;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Particle Swarm",0xe);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x1e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"State Unit Tests",0x10);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0xf;
    pcVar17 = "FAIL";
    if (bVar15 != false) {
      pcVar17 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar17,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if (local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ParticleSwarmState::~ParticleSwarmState(local_1f0);
  if ((double *)local_368._0_8_ != (double *)0x0) {
    operator_delete((void *)local_368._0_8_,(long)local_348 - local_368._0_8_);
    local_368._0_8_ = (double *)0x0;
    local_368._8_8_ = local_368._8_8_ & 0xffffffff00000000;
    local_358 = (pointer)0x0;
    uStack_350 = uStack_350 & 0xffffffff00000000;
    local_348 = (_Bit_pointer)0x0;
  }
  if (local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<TasOptimization::ParticleSwarmState,_std::allocator<TasOptimization::ParticleSwarmState>_>
  ::~vector(&local_310);
  if (local_2b8 != (void *)0x0) {
    operator_delete(local_2b8,local_2a8 - (long)local_2b8);
  }
  if (local_298 != (void *)0x0) {
    operator_delete(local_298,local_288 - (long)local_298);
  }
  return bVar15;
}

Assistant:

bool testParticleSwarmState(bool verbose) {
    test_result test;

    // Check size of the accessible vectors generated by different constructors.
    int num_dimensions = 2;
    int num_particles = 15;
    std::vector<double> dummy_positions(num_dimensions * num_particles);
    std::vector<double> dummy_velocities(num_dimensions * num_particles);
    std::vector<ParticleSwarmState> states = {
        ParticleSwarmState(num_dimensions, num_particles),
        ParticleSwarmState(num_dimensions, std::move(dummy_positions), std::move(dummy_velocities))
    };
    for (int i=0; i<2; i++) {
        test.tassert(states[i].getParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getParticleVelocities().size() == Utils::size_mult(num_dimensions, num_particles));
        test.tassert(states[i].getBestParticlePositions().size() == Utils::size_mult(num_dimensions, num_particles+1));
        test.tassert(states[i].getBestPosition().size() == (size_t) num_dimensions);
        std::vector<bool> init_vector = states[i].getStateVector();
        test.tassert(i == 0 ? not init_vector[0] : init_vector[0]);
        test.tassert(i == 0 ? not init_vector[1] : init_vector[1]);
        test.tassert(not init_vector[2]);
        test.tassert(not init_vector[3]);
    }

    // Check TasOptimization::ParticleSwarmState::initializeParticlesInsideBox().
    std::vector<double> lower = {-1.0, 1.0};
    std::vector<double> upper = {2.0, 3.0};
    std::minstd_rand park_miller(42);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    auto get_rand = [&]()->double{ return unif(park_miller); };
    states[0].initializeParticlesInsideBox(lower, upper, get_rand);
    std::vector<double> positions = states[0].getParticlePositions();
    std::vector<double> velocities = states[0].getParticleVelocities();
    for (int i=0; i<num_particles * num_dimensions; i++) {
        test.tassert(positions[i] >= lower[i % num_dimensions] - TasGrid::Maths::num_tol);
        test.tassert(positions[i] <= upper[i % num_dimensions] + TasGrid::Maths::num_tol);
        double range = fabs(upper[i % num_dimensions] - lower[i % num_dimensions]);
        test.tassert(velocities[i] >= -range - TasGrid::Maths::num_tol);
        test.tassert(velocities[i] <=  range + TasGrid::Maths::num_tol);
    }
    std::vector<bool> init_vector = states[0].getStateVector();
    test.tassert(init_vector[0] and init_vector[1]);

    // Check the nontrivial setters.
    ParticleSwarmState state(num_dimensions, num_particles);
    std::vector<double> ones1(num_dimensions * num_particles, 1);
    std::vector<double> ones2(num_dimensions * (num_particles + 1), 1);
    state.setParticlePositions(ones1);
    for (auto p : state.getParticlePositions()) test.tassert(p == 1);
    state.setParticleVelocities(ones1);
    for (auto v : state.getParticleVelocities()) test.tassert(v == 1);
    state.setBestParticlePositions(ones2);
    for (auto bp : state.getBestParticlePositions()) test.tassert(bp == 1);
    init_vector = state.getStateVector();
    test.tassert(init_vector[0] and init_vector[1] and init_vector[2]);

    // Check TasOptimization::ParticleSwarmState::clearBestParticles().
    state.clearBestParticles();
    for (auto bp : states[0].getBestParticlePositions()) test.tassert(bp == 0);
    init_vector = state.getStateVector();
    test.tassert(not init_vector[2]);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Particle Swarm", "State Unit Tests");
    return test.success();
}